

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O2

string * __thiscall CFG::toDOT_abi_cxx11_(string *__return_storage_ptr__,CFG *this)

{
  int iVar1;
  Type TVar2;
  long lVar3;
  BlockData *this_00;
  long lVar4;
  CfgNode *node;
  CfgNode *node_00;
  ostream *poVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  _Rb_tree_node_base *p_Var8;
  char *pcVar9;
  _List_node_base *p_Var10;
  _Self __tmp;
  int local_26c;
  list<Instruction_*,_std::allocator<Instruction_*>_> instrs;
  _Rb_tree<CfgCall_*,_CfgCall_*,_std::_Identity<CfgCall_*>,_std::less<CfgCall_*>,_std::allocator<CfgCall_*>_>
  local_238;
  stringstream ss;
  long local_1f8 [3];
  uint auStack_1e0 [88];
  undefined1 local_80 [40];
  long local_58;
  string local_50;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  *(uint *)((long)auStack_1e0 + *(long *)(local_1f8[0] + -0x18)) =
       *(uint *)((long)auStack_1e0 + *(long *)(local_1f8[0] + -0x18)) & 0xffffffb5 | 8;
  poVar5 = std::operator<<((ostream *)local_1f8,"digraph \"0x");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::operator<<(poVar5,"\" {");
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)local_1f8,"  label = \"0x");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::operator<<(poVar5," (");
  poVar5 = std::operator<<(poVar5,(string *)&this->m_functionName);
  poVar5 = std::operator<<(poVar5,")\"");
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)local_1f8,"  labelloc = \"t\"");
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)local_1f8,"  node[shape=record]");
  std::endl<char,std::char_traits<char>>(poVar5);
  std::endl<char,std::char_traits<char>>((ostream *)local_1f8);
  p_Var7 = (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_26c = 1;
  do {
    if ((_Rb_tree_header *)p_Var7 == &(this->m_nodes)._M_t._M_impl.super__Rb_tree_header) {
      p_Var8 = (this->m_edges)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        if ((_Rb_tree_header *)p_Var8 == &(this->m_edges)._M_t._M_impl.super__Rb_tree_header) {
          poVar5 = std::operator<<((ostream *)local_1f8,"}");
          std::endl<char,std::char_traits<char>>(poVar5);
          std::__cxx11::stringbuf::str();
          std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
          return __return_storage_ptr__;
        }
        lVar3 = *(long *)(p_Var8 + 1);
        *(uint *)((long)auStack_1e0 + *(long *)(local_1f8[0] + -0x18)) =
             *(uint *)((long)auStack_1e0 + *(long *)(local_1f8[0] + -0x18)) & 0xffffffb5 | 8;
        node = *(CfgNode **)(lVar3 + 8);
        if (node->m_type - CFG_BLOCK < 2) {
          poVar5 = std::operator<<((ostream *)local_1f8,"  \"0x");
          CfgNode::node2addr(node);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          pcVar9 = "\" -> ";
        }
        else {
          poVar5 = (ostream *)local_1f8;
          pcVar9 = "  Entry -> ";
          if (node->m_type != CFG_ENTRY) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                          ,0x17e,"std::string CFG::toDOT() const");
          }
        }
        std::operator<<(poVar5,pcVar9);
        node_00 = *(CfgNode **)(lVar3 + 0x10);
        TVar2 = node_00->m_type;
        if (TVar2 - CFG_BLOCK < 2) {
          poVar5 = std::operator<<((ostream *)local_1f8,"\"0x");
          CfgNode::node2addr(node_00);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          pcVar9 = "\"";
        }
        else {
          poVar5 = (ostream *)local_1f8;
          pcVar9 = "Exit";
          if (TVar2 != CFG_EXIT) {
            if (TVar2 != CFG_HALT) {
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                            ,399,"std::string CFG::toDOT() const");
            }
            pcVar9 = "Halt";
          }
        }
        std::operator<<(poVar5,pcVar9);
        TVar2 = node->m_type;
        *(uint *)((long)auStack_1e0 + *(long *)(local_1f8[0] + -0x18)) =
             *(uint *)((long)auStack_1e0 + *(long *)(local_1f8[0] + -0x18)) & 0xffffffb5 | 2;
        if (TVar2 == CFG_ENTRY) {
          poVar5 = std::operator<<((ostream *)local_1f8," [label=\" ");
        }
        else {
          poVar5 = std::operator<<((ostream *)local_1f8," [label=\" ");
        }
        poVar5 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar5);
        std::operator<<(poVar5,"\"]");
        std::endl<char,std::char_traits<char>>((ostream *)local_1f8);
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
      } while( true );
    }
    lVar3 = *(long *)(p_Var7 + 1);
    pcVar9 = "  Entry [label=\"\",width=0.3,height=0.3,shape=circle,fillcolor=black,style=filled]";
    switch(*(undefined4 *)(lVar3 + 8)) {
    case 0:
      break;
    case 1:
      this_00 = *(BlockData **)(lVar3 + 0x10);
      if (this_00 == (BlockData *)0x0) {
        __assert_fail("node->data() != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                      ,0x120,"std::string CFG::toDOT() const");
      }
      poVar5 = std::operator<<((ostream *)local_1f8,"  \"0x");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5,"\" [label=\"{");
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)local_1f8,"    0x");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5," [");
      *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
           *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,this_00->m_size);
      poVar5 = std::operator<<(poVar5,"]\\l");
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::list<Instruction_*,_std::allocator<Instruction_*>_>::list
                (&instrs,&this_00->m_instrs);
      if (instrs.super__List_base<Instruction_*,_std::allocator<Instruction_*>_>._M_impl._M_node.
          _M_size != 0) {
        poVar5 = std::operator<<((ostream *)local_1f8,"    | [instrs]\\l");
        std::endl<char,std::char_traits<char>>(poVar5);
        p_Var10 = (_List_node_base *)&instrs;
        while (p_Var10 = (((_List_base<Instruction_*,_std::allocator<Instruction_*>_> *)
                          &p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
              p_Var10 != (_List_node_base *)&instrs) {
          lVar3 = (long)p_Var10[1]._M_next;
          poVar5 = std::operator<<((ostream *)local_1f8,"    &nbsp;&nbsp;0x");
          *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
               *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          poVar5 = std::operator<<(poVar5," \\<+");
          *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
               *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,*(int *)(lVar3 + 0x10));
          poVar5 = std::operator<<(poVar5,"\\>: ");
          dotFilter((string *)&local_238,(string *)(lVar3 + 0x18));
          poVar5 = std::operator<<(poVar5,(string *)&local_238);
          poVar5 = std::operator<<(poVar5,"\\l");
          std::endl<char,std::char_traits<char>>(poVar5);
          std::__cxx11::string::~string((string *)&local_238);
        }
      }
      CfgNode::BlockData::calls
                ((set<CfgCall_*,_std::less<CfgCall_*>,_std::allocator<CfgCall_*>_> *)&local_238,
                 this_00);
      if (local_238._M_impl.super__Rb_tree_header._M_node_count != 0) {
        poVar5 = std::operator<<((ostream *)local_1f8,"    | [calls]\\l");
        std::endl<char,std::char_traits<char>>(poVar5);
        for (p_Var6 = local_238._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var6 != &local_238._M_impl.super__Rb_tree_header;
            p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
          lVar3 = *(long *)(*(long *)(p_Var6 + 1) + 8);
          lVar4 = *(long *)(*(long *)(p_Var6 + 1) + 0x10);
          *(uint *)((long)auStack_1e0 + *(long *)(local_1f8[0] + -0x18)) =
               *(uint *)((long)auStack_1e0 + *(long *)(local_1f8[0] + -0x18)) & 0xffffffb5 | 8;
          poVar5 = std::operator<<((ostream *)local_1f8,"    &nbsp;&nbsp;0x");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          if (lVar4 != 0) {
            *(uint *)((long)auStack_1e0 + *(long *)(local_1f8[0] + -0x18)) =
                 *(uint *)((long)auStack_1e0 + *(long *)(local_1f8[0] + -0x18)) & 0xffffffb5 | 2;
            poVar5 = std::operator<<((ostream *)local_1f8," \\{");
            poVar5 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar5);
            std::operator<<(poVar5,"\\} ");
          }
          poVar5 = std::operator<<((ostream *)local_1f8," (");
          dotFilter((string *)local_80,(string *)(lVar3 + 0x18));
          poVar5 = std::operator<<(poVar5,(string *)local_80);
          poVar5 = std::operator<<(poVar5,")\\l");
          std::endl<char,std::char_traits<char>>(poVar5);
          std::__cxx11::string::~string((string *)local_80);
        }
      }
      CfgNode::BlockData::signalHandlers
                ((set<CfgSignalHandler_*,_std::less<CfgSignalHandler_*>,_std::allocator<CfgSignalHandler_*>_>
                  *)local_80,this_00);
      if (local_58 != 0) {
        poVar5 = std::operator<<((ostream *)local_1f8,"    | [signals]\\l");
        std::endl<char,std::char_traits<char>>(poVar5);
        for (p_Var8 = (_Rb_tree_node_base *)local_80._24_8_;
            p_Var8 != (_Rb_tree_node_base *)(local_80 + 8);
            p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
          lVar3 = *(long *)(p_Var8 + 1);
          iVar1 = *(int *)(lVar3 + 8);
          lVar4 = *(long *)(lVar3 + 0x10);
          lVar3 = *(long *)(lVar3 + 0x18);
          *(uint *)((long)auStack_1e0 + *(long *)(local_1f8[0] + -0x18)) =
               *(uint *)((long)auStack_1e0 + *(long *)(local_1f8[0] + -0x18)) & 0xffffffb5 | 2;
          poVar5 = std::operator<<((ostream *)local_1f8,"    &nbsp;&nbsp;");
          poVar5 = std::operator<<(poVar5,0x30);
          *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 2;
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar1);
          std::operator<<(poVar5,": ");
          *(uint *)((long)auStack_1e0 + *(long *)(local_1f8[0] + -0x18)) =
               *(uint *)((long)auStack_1e0 + *(long *)(local_1f8[0] + -0x18)) & 0xffffffb5 | 8;
          poVar5 = std::operator<<((ostream *)local_1f8,"0x");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          if (lVar3 != 0) {
            *(uint *)((long)auStack_1e0 + *(long *)(local_1f8[0] + -0x18)) =
                 *(uint *)((long)auStack_1e0 + *(long *)(local_1f8[0] + -0x18)) & 0xffffffb5 | 2;
            poVar5 = std::operator<<((ostream *)local_1f8," \\{");
            poVar5 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar5);
            std::operator<<(poVar5,"\\} ");
          }
          poVar5 = std::operator<<((ostream *)local_1f8," (");
          dotFilter(&local_50,(string *)(lVar4 + 0x18));
          poVar5 = std::operator<<(poVar5,(string *)&local_50);
          poVar5 = std::operator<<(poVar5,")\\l");
          std::endl<char,std::char_traits<char>>(poVar5);
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
      poVar5 = std::operator<<((ostream *)local_1f8,"  }\"]");
      std::endl<char,std::char_traits<char>>(poVar5);
      if (this_00->m_indirect == true) {
        poVar5 = std::operator<<((ostream *)local_1f8,"  \"Unknown");
        *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
             *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,local_26c);
        poVar5 = std::operator<<(poVar5,"\" [label=\"?\", shape=none]");
        std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<((ostream *)local_1f8,"  \"0x");
        *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
             *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        poVar5 = std::operator<<(poVar5,"\" -> \"Unknown");
        *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
             *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,local_26c);
        poVar5 = std::operator<<(poVar5,"\" [style=dashed]");
        std::endl<char,std::char_traits<char>>(poVar5);
        local_26c = local_26c + 1;
      }
      *(uint *)((long)auStack_1e0 + *(long *)(local_1f8[0] + -0x18)) =
           *(uint *)((long)auStack_1e0 + *(long *)(local_1f8[0] + -0x18)) & 0xffffffb5 | 8;
      std::
      _Rb_tree<CfgSignalHandler_*,_CfgSignalHandler_*,_std::_Identity<CfgSignalHandler_*>,_std::less<CfgSignalHandler_*>,_std::allocator<CfgSignalHandler_*>_>
      ::~_Rb_tree((_Rb_tree<CfgSignalHandler_*,_CfgSignalHandler_*,_std::_Identity<CfgSignalHandler_*>,_std::less<CfgSignalHandler_*>,_std::allocator<CfgSignalHandler_*>_>
                   *)local_80);
      std::
      _Rb_tree<CfgCall_*,_CfgCall_*,_std::_Identity<CfgCall_*>,_std::less<CfgCall_*>,_std::allocator<CfgCall_*>_>
      ::~_Rb_tree(&local_238);
      std::__cxx11::_List_base<Instruction_*,_std::allocator<Instruction_*>_>::_M_clear
                (&instrs.super__List_base<Instruction_*,_std::allocator<Instruction_*>_>);
      goto LAB_00107748;
    case 2:
      if (*(long *)(lVar3 + 0x10) == 0) {
        __assert_fail("node->data() != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                      ,0x163,"std::string CFG::toDOT() const");
      }
      poVar5 = std::operator<<((ostream *)local_1f8,"  \"0x");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5,"\" [label=\"{");
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)local_1f8,"     0x");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5,"\\l");
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)local_1f8,"  }\", style=dashed]");
      std::endl<char,std::char_traits<char>>(poVar5);
      goto LAB_00107748;
    case 3:
      pcVar9 = 
      "  Exit [label=\"\",width=0.3,height=0.3,shape=circle,fillcolor=black,style=filled,peripheries=2]"
      ;
      break;
    case 4:
      pcVar9 = 
      "  Halt [label=\"\",width=0.3,height=0.3,shape=square,fillcolor=black,style=filled,peripheries=2]"
      ;
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                    ,0x16d,"std::string CFG::toDOT() const");
    }
    poVar5 = std::operator<<((ostream *)local_1f8,pcVar9);
    std::endl<char,std::char_traits<char>>(poVar5);
LAB_00107748:
    p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
  } while( true );
}

Assistant:

std::string CFG::toDOT() const {
	std::stringstream ss;
	int unknown = 1;

	ss << std::hex;
	ss << "digraph \"0x" << m_addr << "\" {" << std::endl;
	ss << "  label = \"0x" << m_addr << " (" << m_functionName << ")\"" << std::endl;
    ss << "  labelloc = \"t\"" << std::endl;
    ss << "  node[shape=record]" << std::endl;
    ss << std::endl;

	for (CfgNode* node : m_nodes) {
		switch (node->type()) {
			case CfgNode::CFG_ENTRY:
			    ss << "  Entry [label=\"\",width=0.3,height=0.3,shape=circle,fillcolor=black,style=filled]" << std::endl;
			    break;
			case CfgNode::CFG_EXIT:
				ss << "  Exit [label=\"\",width=0.3,height=0.3,shape=circle,fillcolor=black,style=filled,peripheries=2]" << std::endl;
			    break;
			case CfgNode::CFG_HALT:
				ss << "  Halt [label=\"\",width=0.3,height=0.3,shape=square,fillcolor=black,style=filled,peripheries=2]" << std::endl;
			    break;
			case CfgNode::CFG_BLOCK: {
				assert(node->data() != 0);
				CfgNode::BlockData* blockData = static_cast<CfgNode::BlockData*>(node->data());

				Addr addr =  blockData->addr();
				ss << "  \"0x" << addr << "\" [label=\"{" << std::endl;
				ss << "    0x" << addr << " [" << std::dec << blockData->size() << "]\\l" << std::endl;

				std::list<Instruction*> instrs = blockData->instructions();
				if (instrs.size() > 0) {
					ss << "    | [instrs]\\l" << std::endl;
					for (std::list<Instruction*>::const_iterator it = instrs.cbegin(), ed = instrs.cend();
							it != ed; it++) {
						Instruction* instr = *it;
						ss << "    &nbsp;&nbsp;0x" << std::hex << instr->addr() << " \\<+"
								<< std::dec << instr->size() << "\\>: " << dotFilter(instr->text())
								<< "\\l" << std::endl;
					}
				}

				const std::set<CfgCall*>& calls = blockData->calls();
				if (!calls.empty()) {
					ss << "    | [calls]\\l" << std::endl;
					for (std::set<CfgCall*>::const_iterator it = calls.cbegin(), ed = calls.cend();
							it != ed; it++) {
						CFG* called = (*it)->called();
						unsigned long long count = (*it)->count();

						ss << std::hex << "    &nbsp;&nbsp;0x" << called->addr();
						if (count > 0)
							ss << std::dec << " \\{" << count << "\\} ";

						ss << " ("
							<< dotFilter(called->functionName()) << ")\\l" << std::endl;
					}
				}

				const std::set<CfgSignalHandler*>& signalHandlers = blockData->signalHandlers();
				if (!signalHandlers.empty()) {
					ss << "    | [signals]\\l" << std::endl;
					for (std::set<CfgSignalHandler*>::const_iterator it = signalHandlers.cbegin(),
							ed = signalHandlers.cend(); it != ed; it++) {
						int sigid = (*it)->sigid();
						CFG* handler = (*it)->handler();
						unsigned long long count = (*it)->count();

						ss << std::dec << "    &nbsp;&nbsp;" << std::setfill('0') << std::setw(2) << sigid << ": ";
						ss << std::hex << "0x" << handler->addr();
						if (count > 0)
							ss << std::dec << " \\{" << count << "\\} ";

						ss << " ("
							<< dotFilter(handler->functionName()) << ")\\l" << std::endl;
					}
				}

				ss << "  }\"]" << std::endl;

                if (blockData->indirect()) {
					ss << "  \"Unknown" << std::dec << unknown << "\" [label=\"?\", shape=none]" << std::endl;
					ss << "  \"0x" << std::hex << blockData->addr() << "\" -> \"Unknown" << std::dec << unknown << "\" [style=dashed]" << std::endl;
                    unknown++;
                }

				ss << std::hex;
				break;
			}
			case CfgNode::CFG_PHANTOM: {
				assert(node->data() != 0);
				CfgNode::PhantomData* phantomData = static_cast<CfgNode::PhantomData*>(node->data());

				ss << "  \"0x" << phantomData->addr() << "\" [label=\"{" << std::endl;
				ss << "     0x" << phantomData->addr() << "\\l" << std::endl;
				ss << "  }\", style=dashed]" << std::endl;

				break;
			}
			default:
				assert(false);
		}
	}

	for (CfgEdge* edge : m_edges) {
		ss << std::hex;

		CfgNode* src = edge->source();
		switch (src->type()) {
			case CfgNode::CFG_ENTRY:
				ss << "  Entry -> ";
				break;
			case CfgNode::CFG_BLOCK:
			case CfgNode::CFG_PHANTOM:
				ss << "  \"0x" << CfgNode::node2addr(src) << "\" -> ";
				break;
			default:
				assert(false);
		}

		CfgNode* dst = edge->destination();
		switch (dst->type()) {
			case CfgNode::CFG_EXIT:
				ss << "Exit";
				break;
			case CfgNode::CFG_HALT:
				ss << "Halt";
				break;
			case CfgNode::CFG_BLOCK:
			case CfgNode::CFG_PHANTOM:
				ss << "\"0x" << CfgNode::node2addr(dst) << "\"";
				break;
			case CfgNode::CFG_ENTRY:
			default:
				assert(false);
		}

		if (src->type() == CfgNode::CFG_ENTRY)
			ss << std::dec << " [label=\" " << this->execs() << "\"]";
		else
			ss << std::dec << " [label=\" " << edge->count() << "\"]";

		ss << std::endl;
	}

	ss << "}" << std::endl;

	return ss.str();
}